

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

uint __thiscall capnp::Type::hashCode(Type *this)

{
  anon_union_2_2_d12d5221_for_Type_3 local_32;
  anon_union_2_2_d12d5221_for_Type_3 local_1a;
  Type *pTStack_18;
  uint16_t val;
  Type *this_local;
  
  pTStack_18 = this;
  switch(this->baseType) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    this_local._4_4_ =
         kj::hashCode<capnp::schema::Type::Which_const&,unsigned_char_const&>
                   (&this->baseType,&this->listDepth);
    break;
  case LIST:
    kj::_::unreachable();
  case ENUM:
  case STRUCT:
  case INTERFACE:
    this_local._4_4_ =
         kj::hashCode<capnp::_::RawBrandedSchema_const*const&,unsigned_char_const&>
                   (&(this->field_4).schema,&this->listDepth);
    break;
  case ANY_POINTER:
    if (((this->field_4).schema == (RawBrandedSchema *)0x0) && ((this->isImplicitParam & 1U) == 0))
    {
      local_32 = this->field_3;
    }
    else {
      local_32 = this->field_3;
    }
    local_1a = local_32;
    this_local._4_4_ =
         kj::hashCode<unsigned_short&,bool_const&,unsigned_long_const&>
                   (&local_1a.paramIndex,&this->isImplicitParam,&(this->field_4).scopeId);
    break;
  default:
    kj::_::unreachable();
  }
  return this_local._4_4_;
}

Assistant:

uint Type::hashCode() const {
  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return kj::hashCode(baseType, listDepth);

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      return kj::hashCode(schema, listDepth);

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER: {
      // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
      // both branches compile to the same instructions and can optimize it away.
      uint16_t val = scopeId != 0 || isImplicitParam ?
          paramIndex : static_cast<uint16_t>(anyPointerKind);
      return kj::hashCode(val, isImplicitParam, scopeId);
    }
  }

  KJ_UNREACHABLE;
}